

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void free_sym_typeinfo(MOJOSHADER_free f,void *d,MOJOSHADER_symbolTypeInfo *typeinfo)

{
  ulong uVar1;
  long lVar2;
  
  if (typeinfo->member_count != 0) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      (*f)(*(void **)((long)typeinfo->members + lVar2 + -8),d);
      free_sym_typeinfo(f,d,(MOJOSHADER_symbolTypeInfo *)((long)&typeinfo->members->name + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar1 < typeinfo->member_count);
  }
  (*f)(typeinfo->members,d);
  return;
}

Assistant:

static void free_sym_typeinfo(MOJOSHADER_free f, void *d,
                              MOJOSHADER_symbolTypeInfo *typeinfo)
{
    unsigned int i;
    for (i = 0; i < typeinfo->member_count; i++)
    {
        f((void *) typeinfo->members[i].name, d);
        free_sym_typeinfo(f, d, &typeinfo->members[i].info);
    } // for
    f((void *) typeinfo->members, d);
}